

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O2

void __thiscall Kompositum::Printer::visit(Printer *this,Composite *composite)

{
  IDType IVar1;
  
  doIndentation(this);
  this->indent = this->indent + 1;
  IVar1 = (composite->super_Component).uid;
  if ((composite->children).
      super__Vector_base<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>,_std::allocator<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (composite->children).
      super__Vector_base<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>,_std::allocator<std::unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    printf("- Composite (%lu): empty\n",IVar1);
  }
  else {
    printf("+ Composite (%lu):\n",IVar1);
    Composite::visitChildren(composite,&this->super_Visitor);
  }
  this->indent = this->indent - 1;
  return;
}

Assistant:

void visit(Composite* composite) override {
        doIndentation();
        indent++;

        if (!composite->hasChildren()) {
            printf("- Composite (%lu): empty\n", composite->getID());
        } else {
            printf("+ Composite (%lu):\n", composite->getID());
            composite->visitChildren(*this);
        }

        indent--;
    }